

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

Matrix<float,_2,_4> *
tcu::operator/(Matrix<float,_2,_4> *__return_storage_ptr__,Matrix<float,_2,_4> *a,
              Matrix<float,_2,_4> *b)

{
  Matrix<float,_2,_4> *pMVar1;
  int col_1;
  long lVar2;
  Matrix<float,_2,_4> *res;
  int row;
  float *pfVar3;
  int col;
  long lVar4;
  bool bVar5;
  float fVar6;
  
  pMVar1 = __return_storage_ptr__;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[2].m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[3].m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[0].m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[1].m_data = 0;
  lVar2 = 0;
  pfVar3 = (float *)__return_storage_ptr__;
  do {
    lVar4 = 0;
    do {
      fVar6 = 1.0;
      if (lVar2 != lVar4) {
        fVar6 = 0.0;
      }
      pfVar3[lVar4 * 2] = fVar6;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    pfVar3 = pfVar3 + 1;
    bVar5 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar5);
  lVar2 = 0;
  do {
    lVar4 = 0;
    do {
      ((Vector<tcu::Vector<float,_2>,_4> *)((Vector<float,_2> *)__return_storage_ptr__)->m_data)->
      m_data[0].m_data[lVar4] =
           ((Vector<tcu::Vector<float,_2>,_4> *)((Vector<float,_2> *)a)->m_data)->m_data[0].m_data
           [lVar4] / ((Vector<tcu::Vector<float,_2>,_4> *)((Vector<float,_2> *)b)->m_data)->m_data
                     [0].m_data[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    lVar2 = lVar2 + 1;
    __return_storage_ptr__ = (Matrix<float,_2,_4> *)((long)__return_storage_ptr__ + 8);
    b = (Matrix<float,_2,_4> *)((long)b + 8);
    a = (Matrix<float,_2,_4> *)((long)a + 8);
  } while (lVar2 != 4);
  return pMVar1;
}

Assistant:

Matrix<T, Rows, Cols> operator/ (const Matrix<T, Rows, Cols>& a, const Matrix<T, Rows, Cols>& b)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = a(row, col) / b(row, col);
	return res;
}